

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_HTMLGeneration.cpp
# Opt level: O3

void __thiscall
soul::HTMLGenerator::printStructs(HTMLGenerator *this,HTMLElement *parent,Module *module)

{
  pointer pSVar1;
  pointer pMVar2;
  HTMLElement *this_00;
  HTMLElement *pHVar3;
  HTMLElement *pHVar4;
  HTMLElement *pHVar5;
  Member *member;
  pointer parent_00;
  char *in_R8;
  pointer parent_01;
  string_view value;
  string_view value_00;
  string_view value_01;
  string_view classToUse;
  string_view text;
  string_view classToUse_00;
  string_view text_00;
  string_view text_01;
  string_view value_02;
  string_view value_03;
  string_view text_02;
  string_view classToUse_01;
  string_view text_03;
  string_view text_04;
  string_view value_04;
  string_view text_05;
  string_view name;
  string_view classType;
  string_view classType_00;
  
  if ((module->structs).
      super__Vector_base<soul::SourceCodeModel::Struct,_std::allocator<soul::SourceCodeModel::Struct>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (module->structs).
      super__Vector_base<soul::SourceCodeModel::Struct,_std::allocator<soul::SourceCodeModel::Struct>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    name._M_str = "Structures";
    name._M_len = 10;
    this_00 = createModuleSection(this,parent,name);
    pSVar1 = (module->structs).
             super__Vector_base<soul::SourceCodeModel::Struct,_std::allocator<soul::SourceCodeModel::Struct>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (parent_01 = (module->structs).
                     super__Vector_base<soul::SourceCodeModel::Struct,_std::allocator<soul::SourceCodeModel::Struct>_>
                     ._M_impl.super__Vector_impl_data._M_start; parent_01 != pSVar1;
        parent_01 = parent_01 + 1) {
      pHVar3 = choc::html::HTMLElement::addDiv(this_00);
      value._M_str = "struct";
      value._M_len = 6;
      pHVar3 = choc::html::HTMLElement::setClass(pHVar3,value);
      value_00._M_str =
           (char *)(((_Vector_base<choc::html::HTMLElement,_std::allocator<choc::html::HTMLElement>_>
                      *)&(parent_01->UID)._M_dataplus)->_M_impl).super__Vector_impl_data._M_start;
      value_00._M_len = (size_t)(parent_01->UID)._M_string_length;
      pHVar3 = choc::html::HTMLElement::setID(pHVar3,value_00);
      classType._M_str = in_R8;
      classType._M_len = (size_t)"summary";
      addComment((HTMLGenerator *)pHVar3,(HTMLElement *)parent_01,(Comment *)0x7,classType);
      pHVar3 = choc::html::HTMLElement::addDiv(pHVar3);
      value_01._M_str = "listing";
      value_01._M_len = 7;
      pHVar3 = choc::html::HTMLElement::setClass(pHVar3,value_01);
      pHVar4 = choc::html::HTMLElement::addParagraph(pHVar3);
      classToUse._M_str = "keyword";
      classToUse._M_len = 7;
      pHVar5 = choc::html::HTMLElement::addSpan(pHVar4,classToUse);
      text._M_str = "struct ";
      text._M_len = 7;
      choc::html::HTMLElement::addContent(pHVar5,text);
      classToUse_00._M_str = "struct_name";
      classToUse_00._M_len = 0xb;
      pHVar5 = choc::html::HTMLElement::addSpan(pHVar4,classToUse_00);
      text_00._M_str = (parent_01->shortName)._M_dataplus._M_p;
      text_00._M_len = (parent_01->shortName)._M_string_length;
      choc::html::HTMLElement::addContent(pHVar5,text_00);
      pHVar4 = choc::html::HTMLElement::addLineBreak(pHVar4);
      text_01._M_str = "{";
      text_01._M_len = 1;
      pHVar4 = choc::html::HTMLElement::addContent(pHVar4,text_01);
      choc::html::HTMLElement::addLineBreak(pHVar4);
      pMVar2 = (parent_01->members).
               super__Vector_base<soul::SourceCodeModel::Struct::Member,_std::allocator<soul::SourceCodeModel::Struct::Member>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (parent_00 = (parent_01->members).
                       super__Vector_base<soul::SourceCodeModel::Struct::Member,_std::allocator<soul::SourceCodeModel::Struct::Member>_>
                       ._M_impl.super__Vector_impl_data._M_start; parent_00 != pMVar2;
          parent_00 = parent_00 + 1) {
        pHVar4 = choc::html::HTMLElement::addDiv(pHVar3);
        value_02._M_str = "struct_member";
        value_02._M_len = 0xd;
        pHVar4 = choc::html::HTMLElement::setClass(pHVar4,value_02);
        classType_00._M_str = in_R8;
        classType_00._M_len = (size_t)"summary";
        addComment((HTMLGenerator *)pHVar4,(HTMLElement *)parent_00,(Comment *)0x7,classType_00);
        pHVar4 = choc::html::HTMLElement::addDiv(pHVar4);
        value_03._M_str = "listing";
        value_03._M_len = 7;
        pHVar4 = choc::html::HTMLElement::setClass(pHVar4,value_03);
        printExpression(this,pHVar4,&parent_00->type);
        text_02._M_str = " ";
        text_02._M_len = 1;
        pHVar5 = choc::html::HTMLElement::addContent(pHVar4,text_02);
        classToUse_01._M_str = "member_name";
        classToUse_01._M_len = 0xb;
        pHVar5 = choc::html::HTMLElement::addSpan(pHVar5,classToUse_01);
        text_03._M_str = (parent_00->name)._M_dataplus._M_p;
        text_03._M_len = (parent_00->name)._M_string_length;
        choc::html::HTMLElement::addContent(pHVar5,text_03);
        text_04._M_str = ";";
        text_04._M_len = 1;
        pHVar4 = choc::html::HTMLElement::addContent(pHVar4,text_04);
        choc::html::HTMLElement::addLineBreak(pHVar4);
      }
      pHVar3 = choc::html::HTMLElement::addParagraph(pHVar3);
      value_04._M_str = "code_block";
      value_04._M_len = 10;
      pHVar3 = choc::html::HTMLElement::setClass(pHVar3,value_04);
      text_05._M_str = "}";
      text_05._M_len = 1;
      choc::html::HTMLElement::addContent(pHVar3,text_05);
    }
  }
  return;
}

Assistant:

void printStructs (choc::html::HTMLElement& parent, const SourceCodeModel::Module& module)
    {
        if (! module.structs.empty())
        {
            auto& section = createModuleSection (parent, "Structures");

            for (auto& s : module.structs)
            {
                auto& structDiv = section.addDiv ("struct").setID (s.UID);

                addComment (structDiv, s.comment, "summary");

                auto& codeDiv = structDiv.addDiv ("listing");

                auto& start = codeDiv.addParagraph();
                start.addSpan ("keyword").addContent ("struct ");
                start.addSpan ("struct_name").addContent (s.shortName);
                start.addLineBreak().addContent ("{").addLineBreak();

                for (auto& member : s.members)
                {
                    auto& memberDiv = codeDiv.addDiv().setClass ("struct_member");

                    addComment (memberDiv, member.comment, "summary");

                    auto& memberLine = memberDiv.addDiv ("listing");
                    printExpression (memberLine, member.type);
                    memberLine.addContent (" ").addSpan ("member_name").addContent (member.name);
                    memberLine.addContent (";").addLineBreak();
                }

                codeDiv.addParagraph().setClass ("code_block")
                       .addContent ("}");
            }
        }
    }